

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isNull(iso9660 *iso9660,uchar *h,uint offset,uint bytes)

{
  int iVar1;
  uint local_28;
  uint local_24;
  uint bytes_local;
  uint offset_local;
  uchar *h_local;
  iso9660 *iso9660_local;
  
  local_28 = bytes;
  local_24 = offset;
  while( true ) {
    if (local_28 < 0x800) {
      if (local_28 == 0) {
        iso9660_local._4_4_ = 1;
      }
      else {
        iVar1 = memcmp(iso9660->null,h + local_24,(ulong)local_28);
        iso9660_local._4_4_ = (uint)(iVar1 == 0);
      }
      return iso9660_local._4_4_;
    }
    iVar1 = memcmp(iso9660->null,h + local_24,0x800);
    if (iVar1 == 0) break;
    local_24 = local_24 + 0x800;
    local_28 = local_28 - 0x800;
  }
  return 0;
}

Assistant:

static int
isNull(struct iso9660 *iso9660, const unsigned char *h, unsigned offset,
unsigned bytes)
{

	while (bytes >= sizeof(iso9660->null)) {
		if (!memcmp(iso9660->null, h + offset, sizeof(iso9660->null)))
			return (0);
		offset += sizeof(iso9660->null);
		bytes -= sizeof(iso9660->null);
	}
	if (bytes)
		return memcmp(iso9660->null, h + offset, bytes) == 0;
	else
		return (1);
}